

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

void __thiscall simple_thread_pool::ThreadPoolMgr::checkThreadAndInvoke(ThreadPoolMgr *this)

{
  bool bVar1;
  lock_guard<std::mutex> *in_RDI;
  long *in_FS_OFFSET;
  iterator entry;
  lock_guard<std::mutex> l;
  id tid;
  unordered_map<std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
  local_38 [3];
  _Node_iterator_base<std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
  local_20 [2];
  native_handle_type local_10;
  
  if ((*(byte *)(*in_FS_OFFSET + -0x30) & 1) == 0) {
    local_10 = (native_handle_type)std::this_thread::get_id();
    std::lock_guard<std::mutex>::lock_guard(in_RDI,(mutex_type *)in_stack_ffffffffffffffb8);
    local_20[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
         ::find(in_stack_ffffffffffffffb8,(key_type *)0x10c292);
    local_38[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
         ::end((unordered_map<std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
                *)local_20[0]._M_cur);
    bVar1 = std::__detail::operator!=(local_20,local_38);
    if (bVar1) {
      *(undefined1 *)(*in_FS_OFFSET + -0x2f) = 1;
    }
    *(undefined1 *)(*in_FS_OFFSET + -0x30) = 1;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10c318);
  }
  if ((((*(byte *)(*in_FS_OFFSET + -0x30) & 1) == 0) ||
      ((*(byte *)(*in_FS_OFFSET + -0x2f) & 1) == 0)) || (((ulong)in_RDI[4]._M_device & 0x100) == 0))
  {
    (**(code **)((long)&(in_RDI->_M_device->super___mutex_base)._M_mutex + 8))();
  }
  return;
}

Assistant:

void checkThreadAndInvoke() {
        // `true` if `is_this_thread_worker` has valid value.
        thread_local bool this_thread_is_identified = false;

        // `true` if this thread is the worker of the thread pool.
        thread_local bool this_thread_is_worker = false;

        if (!this_thread_is_identified) {
            std::thread::id tid = std::this_thread::get_id();

            std::lock_guard<std::mutex> l(threadIdsLock);
            auto entry = threadIds.find(tid);
            if (entry != threadIds.end()) {
                this_thread_is_worker = true;
            }
            this_thread_is_identified = true;
        }

        if ( this_thread_is_identified &&
             this_thread_is_worker &&
             myOpt.activeWorkerMode ) {
            // This is worker thread and in active mode.
            // We don't need to invoke thread loop,
            // as the worker's loop will serve the next task immediately.
        } else {
            // Otherwise, invoke manager's loop.
            invoke();
        }
    }